

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void __thiscall lda::expdigammify_2(lda *this,vw *all,float *gamma,float *norm)

{
  lda_math_mode lVar1;
  ostream *this_00;
  float *in_RCX;
  float *in_RDX;
  vw *in_RSI;
  lda *in_RDI;
  undefined8 in_stack_ffffffffffffff88;
  float threshold;
  float *in_stack_ffffffffffffff90;
  float *in_stack_ffffffffffffff98;
  vw *in_stack_ffffffffffffffa0;
  
  lVar1 = in_RDI->mmode;
  if (lVar1 == USE_SIMD) {
    underflow_threshold(in_RDI);
    ldamath::expdigammify_2<float,(lda_math_mode)0>
              (in_stack_ffffffffffffffa0,in_RCX,in_RDX,(float)((ulong)in_RSI >> 0x20));
  }
  else {
    threshold = (float)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    if (lVar1 == USE_PRECISE) {
      underflow_threshold(in_RDI);
      ldamath::expdigammify_2<float,(lda_math_mode)1>
                (in_RSI,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,threshold);
    }
    else {
      if (lVar1 != USE_FAST_APPROX) {
        this_00 = std::operator<<((ostream *)&std::cerr,
                                  "lda::expdigammify_2: Trampled or invalid math mode, aborting");
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        abort();
      }
      underflow_threshold(in_RDI);
      ldamath::expdigammify_2<float,(lda_math_mode)2>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 threshold);
    }
  }
  return;
}

Assistant:

void lda::expdigammify_2(vw &all, float *gamma, float *norm)
{
  switch (mmode)
  {
    case USE_FAST_APPROX:
      ldamath::expdigammify_2<float, USE_FAST_APPROX>(all, gamma, norm, underflow_threshold());
      break;
    case USE_PRECISE:
      ldamath::expdigammify_2<float, USE_PRECISE>(all, gamma, norm, underflow_threshold());
      break;
    case USE_SIMD:
      ldamath::expdigammify_2<float, USE_SIMD>(all, gamma, norm, underflow_threshold());
      break;
    default:
      std::cerr << "lda::expdigammify_2: Trampled or invalid math mode, aborting" << std::endl;
      abort();
  }
}